

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServiceRequestPdu.cpp
# Opt level: O2

void __thiscall DIS::ServiceRequestPdu::~ServiceRequestPdu(ServiceRequestPdu *this)

{
  (this->super_LogisticsFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__ServiceRequestPdu_001b2040;
  std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::clear(&this->_supplies);
  std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::~vector(&this->_supplies);
  EntityID::~EntityID(&this->_servicingEntityID);
  EntityID::~EntityID(&this->_requestingEntityID);
  LogisticsFamilyPdu::~LogisticsFamilyPdu(&this->super_LogisticsFamilyPdu);
  return;
}

Assistant:

ServiceRequestPdu::~ServiceRequestPdu()
{
    _supplies.clear();
}